

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O3

void __thiscall fs_tests::fsbridge_pathtostring::test_method(fsbridge_pathtostring *this)

{
  undefined8 uVar1;
  int iVar2;
  size_type __n;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  char8_t *__end;
  long in_FS_OFFSET;
  readonly_property<bool> rVar5;
  bool bVar6;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar7;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  string *local_170;
  char *local_168;
  assertion_result local_160;
  shared_count *local_148;
  element_type *local_140;
  shared_count sStack_138;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  string invalid_u8_str;
  u8string str8;
  string u8_str;
  undefined1 local_80 [40];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  u8_str._M_dataplus._M_p = (pointer)&u8_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&u8_str,anon_var_dwarf_9f0349,anon_var_dwarf_9f0349 + 0x11);
  str8._M_dataplus._M_p = (pointer)&str8.field_2;
  std::__cxx11::u8string::_M_construct<char8_t_const*>
            ((u8string *)&str8,anon_var_dwarf_9f0349,anon_var_dwarf_9f0349 + 0x11);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x15;
  file.m_begin = (iterator)&local_190;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a0,msg);
  invalid_u8_str._M_string_length = invalid_u8_str._M_string_length & 0xffffffffffffff00;
  invalid_u8_str._M_dataplus._M_p = "B";
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_80,&u8_str,auto_format);
  std::filesystem::__cxx11::path::path((path *)local_128,(path *)local_80);
  std::filesystem::__cxx11::path::~path((path *)local_80);
  local_100._0_8_ = &aStack_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,local_128._0_8_,(pointer)(local_128._0_8_ + local_128._8_8_));
  if (local_100._8_8_ == u8_str._M_string_length) {
    if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
      rVar5.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_100._0_8_,u8_str._M_dataplus._M_p,local_100._8_8_);
      rVar5.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar5.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_148 = (shared_count *)CONCAT71(local_148._1_7_,rVar5.super_class_property<bool>.value);
  local_140 = (element_type *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_160._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_160.m_message.px = (element_type *)0xe9cac3;
  local_80._24_8_ = &local_170;
  local_80[8] = 0;
  local_80._0_8_ = &PTR__lazy_ostream_013ae148;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_178;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_178 = &u8_str;
  local_170 = (string *)local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_148,(lazy_ostream *)&invalid_u8_str,1,2,REQUIRE,0xe9caec,
             (size_t)&local_160,0x15,(path *)local_80,"u8_str",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&sStack_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ != &aStack_f0) {
    operator_delete((void *)local_100._0_8_,aStack_f0._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)local_128);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x16;
  file_00.m_begin = (iterator)&local_1b0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c0,
             msg_00);
  invalid_u8_str._M_string_length = invalid_u8_str._M_string_length & 0xffffffffffffff00;
  invalid_u8_str._M_dataplus._M_p = "B";
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_58._0_8_ = &local_48;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)local_58,u8_str._M_dataplus._M_p,
             u8_str._M_dataplus._M_p + u8_str._M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)local_80,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_58,
             auto_format);
  std::filesystem::__cxx11::path::path((path *)local_128,(path *)local_80);
  std::filesystem::__cxx11::path::~path((path *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  fs::path::utf8string_abi_cxx11_((string *)local_100,(path *)local_128);
  if (local_100._8_8_ == u8_str._M_string_length) {
    if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
      rVar5.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_100._0_8_,u8_str._M_dataplus._M_p,local_100._8_8_);
      rVar5.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar5.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_148 = (shared_count *)CONCAT71(local_148._1_7_,rVar5.super_class_property<bool>.value);
  local_140 = (element_type *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_160._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_160.m_message.px = (element_type *)0xe9cac3;
  local_80[8] = 0;
  local_80._0_8_ = &PTR__lazy_ostream_013ae148;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_80._24_8_ = &local_170;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_178;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_178 = &u8_str;
  local_170 = (string *)local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_148,(lazy_ostream *)&invalid_u8_str,1,2,REQUIRE,0xe9cb19,
             (size_t)&local_160,0x16,(path *)local_80,"u8_str",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_58)
  ;
  boost::detail::shared_count::~shared_count((shared_count *)&sStack_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ != &aStack_f0) {
    operator_delete((void *)local_100._0_8_,aStack_f0._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)local_128);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x17;
  file_01.m_begin = (iterator)&local_1d0;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
             msg_01);
  invalid_u8_str._M_string_length = invalid_u8_str._M_string_length & 0xffffffffffffff00;
  invalid_u8_str._M_dataplus._M_p = "B";
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)local_80,&str8,auto_format);
  fs::path::utf8string_abi_cxx11_((string *)local_100,(path *)local_80);
  if (local_100._8_8_ == u8_str._M_string_length) {
    if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
      rVar5.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_100._0_8_,u8_str._M_dataplus._M_p,local_100._8_8_);
      rVar5.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar5.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_148 = (shared_count *)CONCAT71(local_148._1_7_,rVar5.super_class_property<bool>.value);
  local_140 = (element_type *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_160._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_160.m_message.px = (element_type *)0xe9cac3;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae148;
  local_118._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_118._8_8_ = &local_170;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_178;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_178 = &u8_str;
  local_170 = (string *)local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_148,(lazy_ostream *)&invalid_u8_str,1,2,REQUIRE,0xe9cb39,
             (size_t)&local_160,0x17,(path *)local_128,"u8_str",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_58)
  ;
  boost::detail::shared_count::~shared_count((shared_count *)&sStack_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ != &aStack_f0) {
    operator_delete((void *)local_100._0_8_,aStack_f0._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)local_80);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000018;
  file_02.m_begin = (iterator)&local_1f0;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_200,
             msg_02);
  _cVar7 = 0x3c54f3;
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)local_80,&str8,auto_format);
  if (CONCAT71(local_80._9_7_,local_80[8]) == 0) {
    local_128._0_8_ = &local_118;
    local_128._8_8_ = 0;
    local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    local_128._0_8_ = &local_118;
    _cVar7 = 0x3c5524;
    std::__cxx11::u8string::_M_construct<char_const*>
              ((u8string *)local_128,local_80._0_8_,
               (pointer)(local_80._0_8_ + CONCAT71(local_80._9_7_,local_80[8])));
  }
  uVar1 = local_128._8_8_;
  __n = local_128._8_8_;
  if (str8._M_string_length < (ulong)local_128._8_8_) {
    __n = str8._M_string_length;
  }
  if (__n != 0) {
    _cVar7 = 0x3c5574;
    iVar2 = bcmp((void *)local_128._0_8_,str8._M_dataplus._M_p,__n);
    if (iVar2 != 0) {
      bVar6 = false;
      goto LAB_003c5582;
    }
  }
  bVar6 = uVar1 == str8._M_string_length;
LAB_003c5582:
  invalid_u8_str._M_dataplus._M_p._0_1_ = bVar6;
  invalid_u8_str._M_string_length = 0;
  invalid_u8_str.field_2._M_allocated_capacity = 0;
  local_100._0_8_ = "fs::path(str8).u8string() == str8";
  local_100._8_8_ = "";
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_208 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_48._8_8_ = (string *)local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_u8_str,(lazy_ostream *)local_58,1,0,WARN,_cVar7,
             (size_t)&local_210,0x18);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&invalid_u8_str.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._0_8_ != &local_118) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
  }
  std::filesystem::__cxx11::path::~path((path *)local_80);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x19;
  file_03.m_begin = (iterator)&local_220;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_230,
             msg_03);
  invalid_u8_str._M_string_length = invalid_u8_str._M_string_length & 0xffffffffffffff00;
  invalid_u8_str._M_dataplus._M_p = "B";
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_80,&u8_str,auto_format);
  std::filesystem::__cxx11::path::path((path *)local_128,(path *)local_80);
  std::filesystem::__cxx11::path::~path((path *)local_80);
  fs::path::utf8string_abi_cxx11_((string *)local_100,(path *)local_128);
  if (local_100._8_8_ == u8_str._M_string_length) {
    if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
      rVar5.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_100._0_8_,u8_str._M_dataplus._M_p,local_100._8_8_);
      rVar5.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar5.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_148 = (shared_count *)CONCAT71(local_148._1_7_,rVar5.super_class_property<bool>.value);
  local_140 = (element_type *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_160._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_160.m_message.px = (element_type *)0xe9cac3;
  local_80[8] = 0;
  local_80._0_8_ = &PTR__lazy_ostream_013ae148;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_80._24_8_ = &local_170;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_178;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_178 = &u8_str;
  local_170 = (string *)local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_148,(lazy_ostream *)&invalid_u8_str,1,2,REQUIRE,0xe9cb77,
             (size_t)&local_160,0x19,(path *)local_80,"u8_str",(lazy_ostream *)local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&sStack_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ != &aStack_f0) {
    operator_delete((void *)local_100._0_8_,aStack_f0._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)local_128);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1a;
  file_04.m_begin = (iterator)&local_240;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_250,
             msg_04);
  invalid_u8_str._M_string_length = invalid_u8_str._M_string_length & 0xffffffffffffff00;
  invalid_u8_str._M_dataplus._M_p = "B";
  invalid_u8_str.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  invalid_u8_str.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_58._0_8_ = &local_48;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)local_58,u8_str._M_dataplus._M_p,
             u8_str._M_dataplus._M_p + u8_str._M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)local_80,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_58,
             auto_format);
  std::filesystem::__cxx11::path::path((path *)local_128,(path *)local_80);
  std::filesystem::__cxx11::path::~path((path *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_100._0_8_ = &aStack_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,local_128._0_8_,(char *)(local_128._0_8_ + local_128._8_8_));
  if (local_100._8_8_ == u8_str._M_string_length) {
    if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
      rVar5.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_100._0_8_,u8_str._M_dataplus._M_p,local_100._8_8_);
      rVar5.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar5.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_148 = (shared_count *)CONCAT71(local_148._1_7_,rVar5.super_class_property<bool>.value);
  local_140 = (element_type *)0x0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_160._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_160.m_message.px = (element_type *)0xe9cac3;
  local_80[8] = 0;
  local_80._0_8_ = &PTR__lazy_ostream_013ae148;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_80._24_8_ = &local_170;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_178;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_178 = &u8_str;
  local_170 = (string *)local_100;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_148,(lazy_ostream *)&invalid_u8_str,1,2,REQUIRE,0xe9cb9f,
             (size_t)&local_160,0x1a,(path *)local_80,"u8_str",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_58)
  ;
  boost::detail::shared_count::~shared_count((shared_count *)&sStack_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ != &aStack_f0) {
    operator_delete((void *)local_100._0_8_,aStack_f0._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)local_128);
  invalid_u8_str._M_dataplus._M_p = (pointer)&invalid_u8_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&invalid_u8_str,anon_var_dwarf_9f042a,anon_var_dwarf_9f042a + 1);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x23;
  file_05.m_begin = (iterator)&local_260;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_270,
             msg_05);
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013ae088;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              invalid_u8_str._M_string_length;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_180._4_4_,1);
  local_100[0] = invalid_u8_str._M_string_length == 1;
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = 0;
  local_148 = (shared_count *)0xe9ca69;
  local_140 = (element_type *)0xe9cac3;
  local_160._0_8_ = &local_178;
  local_80[8] = 0;
  local_80._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae248;
  local_118._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_118._8_8_ = &local_170;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_170 = (string *)&local_180;
  local_80._24_8_ = &local_160;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)local_58,1,2,REQUIRE,0xe9cbc6,
             (size_t)&local_148,0x23,local_80,"1",(path *)local_128);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x24;
  file_06.m_begin = (iterator)&local_280;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_290,
             msg_06);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  aStack_f0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_f0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_80,&invalid_u8_str,auto_format);
  std::filesystem::__cxx11::path::path((path *)local_128,(path *)local_80);
  std::filesystem::__cxx11::path::~path((path *)local_80);
  local_148 = &sStack_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,local_128._0_8_,(pointer)(local_128._0_8_ + local_128._8_8_));
  if (local_140 == (element_type *)invalid_u8_str._M_string_length) {
    if (local_140 == (element_type *)0x0) {
      bVar6 = true;
    }
    else {
      iVar2 = bcmp(local_148,invalid_u8_str._M_dataplus._M_p,(size_t)local_140);
      bVar6 = iVar2 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar6;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_170 = (string *)0xe9ca69;
  local_168 = "";
  local_80[8] = 0;
  local_80._0_8_ = &PTR__lazy_ostream_013ae148;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_80._24_8_ = &local_178;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013ae148;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_180 = &invalid_u8_str;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
  local_48._8_8_ = &local_180;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)local_100,1,2,REQUIRE,0xe9cbdc,(size_t)&local_170,0x24,
             (path *)local_80,"invalid_u8_str",(lazy_ostream *)local_58);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  if ((assertion_result *)local_148 != (assertion_result *)&sStack_138) {
    operator_delete(local_148,(ulong)((long)&(sStack_138.pi_)->_vptr_sp_counted_base + 1));
  }
  std::filesystem::__cxx11::path::~path((path *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invalid_u8_str._M_dataplus._M_p != &invalid_u8_str.field_2) {
    operator_delete(invalid_u8_str._M_dataplus._M_p,invalid_u8_str.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)str8._M_dataplus._M_p != &str8.field_2) {
    operator_delete(str8._M_dataplus._M_p,str8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)u8_str._M_dataplus._M_p != &u8_str.field_2) {
    operator_delete(u8_str._M_dataplus._M_p,u8_str.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_pathtostring)
{
    std::string u8_str = "fs_tests_₿_🏃";
    std::u8string str8{u8"fs_tests_₿_🏃"};
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(u8_str)), u8_str);
    BOOST_CHECK_EQUAL(fs::u8path(u8_str).utf8string(), u8_str);
    BOOST_CHECK_EQUAL(fs::path(str8).utf8string(), u8_str);
    BOOST_CHECK(fs::path(str8).u8string() == str8);
    BOOST_CHECK_EQUAL(fs::PathFromString(u8_str).utf8string(), u8_str);
    BOOST_CHECK_EQUAL(fs::PathToString(fs::u8path(u8_str)), u8_str);
#ifndef WIN32
    // On non-windows systems, verify that arbitrary byte strings containing
    // invalid UTF-8 can be round tripped successfully with PathToString and
    // PathFromString. On non-windows systems, paths are just byte strings so
    // these functions do not do any encoding. On windows, paths are Unicode,
    // and these functions do encoding and decoding, so the behavior of this
    // test would be undefined.
    std::string invalid_u8_str = "\xf0";
    BOOST_CHECK_EQUAL(invalid_u8_str.size(), 1);
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(invalid_u8_str)), invalid_u8_str);
#endif
}